

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::transposeTest<false>(ViewTest *this)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  reference piVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  size_t sVar7;
  size_t sVar8;
  logic_error *plVar9;
  code *pcVar10;
  unsigned_long uVar11;
  undefined *puVar12;
  bool bVar13;
  int *piVar14;
  size_t sVar15;
  size_t sVar16;
  View<int,_false,_std::allocator<unsigned_long>_> w1;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  View<int,_false,_std::allocator<unsigned_long>_> w2;
  View<int,_false,_std::allocator<unsigned_long>_> w3;
  size_t local_150;
  undefined1 local_138 [16];
  size_t *local_128;
  size_t local_110;
  undefined1 local_f8 [16];
  size_t *local_e8;
  size_t local_d0;
  allocator_type local_b5;
  CoordinateOrder local_b4;
  undefined1 local_b0 [16];
  size_t *local_a0;
  size_t local_88;
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  
  _Var4._M_current = (unsigned_long *)operator_new(0x10);
  _Var6._M_current = _Var4._M_current + 2;
  *_Var4._M_current = 6;
  _Var4._M_current[1] = 4;
  piVar14 = this->data_;
  local_f8._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var4,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_138._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var4,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  local_b0._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b0 + 8),_Var4,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
  local_70._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var4,_Var6,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&local_b4);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0,1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0,0,0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70,1,1);
  sVar16 = 0;
  do {
    sVar15 = 0;
    do {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar15);
      iVar1 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_138,sVar15,sVar16);
      if (iVar1 != *piVar5) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar15);
      iVar1 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_b0,sVar16,sVar15);
      if (iVar1 != *piVar5) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar15);
      iVar1 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_70,sVar16,sVar15);
      if (iVar1 != *piVar5) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar15 = sVar15 + 1;
    } while (sVar15 != 4);
    sVar16 = sVar16 + 1;
  } while (sVar16 != 6);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(local_a0,local_88 * 0x18);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var4._M_current,0x10);
  _Var4._M_current = (unsigned_long *)operator_new(0x10);
  _Var6._M_current = _Var4._M_current + 2;
  *_Var4._M_current = 6;
  _Var4._M_current[1] = 4;
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  local_f8._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var4,_Var6,
             (CoordinateOrder *)local_138,&andres::defaultOrder,(allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_138._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var4,_Var6,
             (CoordinateOrder *)local_b0,&andres::defaultOrder,(allocator_type *)local_70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  local_70._0_8_ = local_70._0_8_ & 0xffffffff00000000;
  local_b0._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b0 + 8),_Var4,_Var6,
             (CoordinateOrder *)local_70,&andres::defaultOrder,(allocator_type *)&local_b4);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
  local_b4 = FirstMajorOrder;
  local_70._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var4,_Var6,&local_b4,
             &andres::defaultOrder,&local_b5);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0,1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0,0,0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70,1,1);
  sVar16 = 0;
  do {
    sVar15 = 0;
    do {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar15);
      iVar1 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_138,sVar15,sVar16);
      if (iVar1 != *piVar5) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar15);
      iVar1 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_b0,sVar16,sVar15);
      if (iVar1 != *piVar5) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_f8,sVar16,sVar15);
      iVar1 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_70,sVar16,sVar15);
      if (iVar1 != *piVar5) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar15 = sVar15 + 1;
    } while (sVar15 != 4);
    sVar16 = sVar16 + 1;
  } while (sVar16 != 6);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(local_a0,local_88 * 0x18);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var4._M_current,0x10);
  _Var6._M_current = (unsigned_long *)operator_new(0x18);
  *_Var6._M_current = 3;
  _Var6._M_current[1] = 4;
  _Var6._M_current[2] = 2;
  local_f8._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_138._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0,1);
  local_150 = 0;
  do {
    sVar16 = 0;
    do {
      uVar11 = 0;
      bVar3 = true;
      do {
        bVar13 = bVar3;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
LAB_001ad627:
          pcVar10 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001ad635:
          __cxa_throw(plVar9,puVar12,pcVar10);
        }
        sVar15 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,3,sVar16,
                           uVar11);
        iVar1 = *(int *)(uVar2 + (sVar15 * local_150 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          goto LAB_001ad627;
        }
        sVar15 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,3,local_150
                           ,uVar11);
        if (iVar1 != *(int *)(uVar2 + (sVar15 * sVar16 + sVar7) * 4)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001ad635;
        }
        uVar11 = 1;
        bVar3 = false;
      } while (bVar13);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    local_150 = local_150 + 1;
  } while (local_150 != 3);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var6._M_current,0x18);
  _Var6._M_current = (unsigned_long *)operator_new(0x18);
  *_Var6._M_current = 3;
  _Var6._M_current[1] = 4;
  _Var6._M_current[2] = 2;
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  local_f8._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),(CoordinateOrder *)local_138,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_138._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),(CoordinateOrder *)local_b0,&andres::defaultOrder,
             (allocator_type *)local_70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0,1);
  local_150 = 0;
  do {
    sVar16 = 0;
    do {
      uVar11 = 0;
      bVar3 = true;
      do {
        bVar13 = bVar3;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
LAB_001ad6a3:
          pcVar10 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001ad6b1:
          __cxa_throw(plVar9,puVar12,pcVar10);
        }
        sVar15 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,3,sVar16,
                           uVar11);
        iVar1 = *(int *)(uVar2 + (sVar15 * local_150 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          goto LAB_001ad6a3;
        }
        sVar15 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,3,local_150
                           ,uVar11);
        if (iVar1 != *(int *)(uVar2 + (sVar15 * sVar16 + sVar7) * 4)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001ad6b1;
        }
        uVar11 = 1;
        bVar3 = false;
      } while (bVar13);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    local_150 = local_150 + 1;
  } while (local_150 != 3);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var6._M_current,0x18);
  _Var6._M_current = (unsigned_long *)operator_new(0x18);
  *_Var6._M_current = 3;
  _Var6._M_current[1] = 4;
  _Var6._M_current[2] = 2;
  local_f8._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_138._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0,2);
  local_150 = 0;
  do {
    sVar16 = 0;
    do {
      uVar11 = 0;
      bVar3 = true;
      do {
        bVar13 = bVar3;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
LAB_001ad71f:
          pcVar10 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001ad72d:
          __cxa_throw(plVar9,puVar12,pcVar10);
        }
        sVar15 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,3,sVar16,
                           uVar11);
        iVar1 = *(int *)(uVar2 + (sVar15 * local_150 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          goto LAB_001ad71f;
        }
        sVar15 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,3,sVar16,
                           local_150);
        if (iVar1 != *(int *)(uVar2 + (sVar15 * uVar11 + sVar7) * 4)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001ad72d;
        }
        uVar11 = 1;
        bVar3 = false;
      } while (bVar13);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    local_150 = local_150 + 1;
  } while (local_150 != 3);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var6._M_current,0x18);
  _Var6._M_current = (unsigned_long *)operator_new(0x18);
  *_Var6._M_current = 3;
  _Var6._M_current[1] = 4;
  _Var6._M_current[2] = 2;
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  local_f8._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),(CoordinateOrder *)local_138,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_138._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),(CoordinateOrder *)local_b0,&andres::defaultOrder,
             (allocator_type *)local_70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0,2);
  local_150 = 0;
  do {
    sVar16 = 0;
    do {
      uVar11 = 0;
      bVar3 = true;
      do {
        bVar13 = bVar3;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
LAB_001ad79b:
          pcVar10 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001ad7a9:
          __cxa_throw(plVar9,puVar12,pcVar10);
        }
        sVar15 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,3,sVar16,
                           uVar11);
        iVar1 = *(int *)(uVar2 + (sVar15 * local_150 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          goto LAB_001ad79b;
        }
        sVar15 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,3,sVar16,
                           local_150);
        if (iVar1 != *(int *)(uVar2 + (sVar15 * uVar11 + sVar7) * 4)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001ad7a9;
        }
        uVar11 = 1;
        bVar3 = false;
      } while (bVar13);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    local_150 = local_150 + 1;
  } while (local_150 != 3);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var6._M_current,0x18);
  _Var6._M_current = (unsigned_long *)operator_new(0x18);
  *_Var6._M_current = 3;
  _Var6._M_current[1] = 4;
  _Var6._M_current[2] = 2;
  local_f8._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_138._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,1,2);
  local_150 = 0;
  do {
    sVar16 = 0;
    do {
      sVar15 = 0;
      bVar3 = true;
      do {
        bVar13 = bVar3;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
LAB_001ad817:
          pcVar10 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001ad825:
          __cxa_throw(plVar9,puVar12,pcVar10);
        }
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,3,sVar16,
                           sVar15);
        iVar1 = *(int *)(uVar2 + (sVar7 * local_150 + sVar8) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          goto LAB_001ad817;
        }
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar15 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,3,sVar15,
                            sVar16);
        if (iVar1 != *(int *)(uVar2 + (sVar7 * local_150 + sVar15) * 4)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001ad825;
        }
        sVar15 = 1;
        bVar3 = false;
      } while (bVar13);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    local_150 = local_150 + 1;
  } while (local_150 != 3);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(_Var6._M_current,0x18);
  _Var6._M_current = (unsigned_long *)operator_new(0x18);
  *_Var6._M_current = 3;
  _Var6._M_current[1] = 4;
  _Var6._M_current[2] = 2;
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  local_f8._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),(CoordinateOrder *)local_138,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_138._0_8_ = piVar14;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 3),(CoordinateOrder *)local_b0,&andres::defaultOrder,
             (allocator_type *)local_70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,1,2);
  local_150 = 0;
  do {
    sVar16 = 0;
    do {
      sVar15 = 0;
      bVar3 = true;
      do {
        bVar13 = bVar3;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
        uVar2 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
LAB_001ad893:
          pcVar10 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001ad8a1:
          __cxa_throw(plVar9,puVar12,pcVar10);
        }
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,3,sVar16,
                           sVar15);
        iVar1 = *(int *)(uVar2 + (sVar7 * local_150 + sVar8) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138);
        uVar2 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          goto LAB_001ad893;
        }
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar15 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                 elementAccessHelper<unsigned_long>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_138,3,sVar15,
                            sVar16);
        if (iVar1 != *(int *)(uVar2 + (sVar7 * local_150 + sVar15) * 4)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar12 = &std::logic_error::typeinfo;
          goto LAB_001ad8a1;
        }
        sVar15 = 1;
        bVar3 = false;
      } while (bVar13);
      sVar16 = sVar16 + 1;
    } while (sVar16 != 4);
    local_150 = local_150 + 1;
    if (local_150 == 3) {
      operator_delete(local_128,local_110 * 0x18);
      operator_delete(local_e8,local_d0 * 0x18);
      operator_delete(_Var6._M_current,0x18);
      return;
    }
  } while( true );
}

Assistant:

void ViewTest::transposeTest()
{
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_);
        w1.transpose(0,1);
        w2.transpose(0,0);
        w3.transpose(1,1);

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
                test(v(x, y) == w3(x, y));
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        w1.transpose(0,1);
        w2.transpose(0,0);
        w3.transpose(1,1);

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
                test(v(x, y) == w3(x, y));
            }
        }
    }
    // 3D with...
    {
        // shape[0], shape[1]
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_);
            w.transpose(0,1);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(y, x, z));
                    }
                }
            }
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            w.transpose(0,1);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(y, x, z));
                    }
                }
            }
        }
        // shape[0], shape[2]
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_);
            w.transpose(0,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {

                        test(v(x, y, z) == w(z, y, x));
                    }
                }
            }
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            w.transpose(0,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(z, y, x));
                    }
                }
            }
        }
        // shape[1], shape[2]
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_);
            w.transpose(1,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(x, z, y));
                    }
                }
            }
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            w.transpose(1,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(x, z, y));
                    }
                }
            }
        }
    }
}